

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DeleteAll(Fts3Table *p,int bContent)

{
  int local_18;
  int local_14;
  int rc;
  int bContent_local;
  Fts3Table *p_local;
  
  local_18 = 0;
  local_14 = bContent;
  _rc = p;
  sqlite3Fts3PendingTermsClear(p);
  if (local_14 != 0) {
    fts3SqlExec(&local_18,_rc,2,(sqlite3_value **)0x0);
  }
  fts3SqlExec(&local_18,_rc,3,(sqlite3_value **)0x0);
  fts3SqlExec(&local_18,_rc,4,(sqlite3_value **)0x0);
  if (_rc->bHasDocsize != '\0') {
    fts3SqlExec(&local_18,_rc,5,(sqlite3_value **)0x0);
  }
  if (_rc->bHasStat != '\0') {
    fts3SqlExec(&local_18,_rc,6,(sqlite3_value **)0x0);
  }
  return local_18;
}

Assistant:

static int fts3DeleteAll(Fts3Table *p, int bContent){
  int rc = SQLITE_OK;             /* Return code */

  /* Discard the contents of the pending-terms hash table. */
  sqlite3Fts3PendingTermsClear(p);

  /* Delete everything from the shadow tables. Except, leave %_content as
  ** is if bContent is false.  */
  assert( p->zContentTbl==0 || bContent==0 );
  if( bContent ) fts3SqlExec(&rc, p, SQL_DELETE_ALL_CONTENT, 0);
  fts3SqlExec(&rc, p, SQL_DELETE_ALL_SEGMENTS, 0);
  fts3SqlExec(&rc, p, SQL_DELETE_ALL_SEGDIR, 0);
  if( p->bHasDocsize ){
    fts3SqlExec(&rc, p, SQL_DELETE_ALL_DOCSIZE, 0);
  }
  if( p->bHasStat ){
    fts3SqlExec(&rc, p, SQL_DELETE_ALL_STAT, 0);
  }
  return rc;
}